

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

_Bool rf_libc_load_file_into_buffer(void *user_data,char *filename,void *dst,rf_int dst_size)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  size_t sVar3;
  int iVar4;
  _Bool _Var5;
  
  __stream = fopen(filename,"rb");
  _Var5 = false;
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    lVar2 = ftell(__stream);
    fseek(__stream,0,0);
    iVar4 = (int)lVar2;
    _Var5 = false;
    if (iVar4 <= dst_size) {
      sVar3 = fread(dst,1,(long)iVar4,__stream);
      iVar1 = ferror(__stream);
      _Var5 = (int)sVar3 == iVar4 && iVar1 == 0;
    }
  }
  fclose(__stream);
  return _Var5;
}

Assistant:

RF_API bool rf_libc_load_file_into_buffer(void* user_data, const char* filename, void* dst, rf_int dst_size)
{
    ((void)user_data);
    bool result = false;

    FILE* file = fopen(filename, "rb");
    if (file != NULL)
    {
        fseek(file, 0L, SEEK_END);
        int file_size = ftell(file);
        fseek(file, 0L, SEEK_SET);

        if (dst_size >= file_size)
        {
            int read_size = fread(dst, 1, file_size, file);
            int no_error = ferror(file) == 0;
            if (no_error && read_size == file_size)
            {
                result = true;
            }
        }
        // else log_error buffer is not big enough
    }
    // else log error could not open file

    fclose(file);

    return result;
}